

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationSmokeTests.cpp
# Opt level: O3

void vkt::synchronization::anon_unknown_0::buildShaders(SourceCollections *shaderCollection)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ProgramSources *pPVar3;
  long *local_98;
  long local_90;
  long local_88 [2];
  string local_78;
  uint local_58;
  value_type local_50;
  
  paVar1 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"glslvert","");
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&shaderCollection->glslSources,&local_78);
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,
             "#version 310 es\nprecision mediump float;\nlayout (location = 0) in vec4 vertexPosition;\nvoid main()\n{\n\tgl_Position = vertexPosition;\n}\n"
             ,"");
  local_58 = 0;
  paVar2 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_98,local_90 + (long)local_98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar3->sources + local_58,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"glslfrag","");
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&shaderCollection->glslSources,&local_78);
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,
             "#version 310 es\nprecision mediump float;\nlayout (location = 0) out vec4 outputColor;\nvoid main()\n{\n\toutputColor = vec4(1.0, 0.0, 0.0, 1.0);\n}\n"
             ,"");
  local_58 = 1;
  local_50._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_98,local_90 + (long)local_98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar3->sources + local_58,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void buildShaders (SourceCollections& shaderCollection)
{
	shaderCollection.glslSources.add("glslvert") <<
		glu::VertexSource(
				"#version 310 es\n"
				"precision mediump float;\n"
				"layout (location = 0) in vec4 vertexPosition;\n"
				"void main()\n"
				"{\n"
				"	gl_Position = vertexPosition;\n"
				"}\n");

	shaderCollection.glslSources.add("glslfrag") <<
		glu::FragmentSource(
				"#version 310 es\n"
				"precision mediump float;\n"
				"layout (location = 0) out vec4 outputColor;\n"
				"void main()\n"
				"{\n"
				"	outputColor = vec4(1.0, 0.0, 0.0, 1.0);\n"
				"}\n");
}